

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O1

void __thiscall
aggreports::FillWheatsheafItems
          (aggreports *this,outkey2 key,
          map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
          *items,OASIS_FLOAT loss,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *maxPeriodNo,
          map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *unusedperiodstoweighting)

{
  iterator __position;
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  _Base_ptr p_Var4;
  mapped_type_conflict1 *pmVar5;
  vector<lossval,std::allocator<lossval>> *this_00;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_double>_>,_std::_Rb_tree_iterator<std::pair<const_int,_double>_>_>
  pVar8;
  wheatkey wk;
  lossval lv;
  undefined8 local_58;
  int local_50;
  key_type local_48;
  lossval local_40;
  
  local_50 = key.sidx;
  local_48.summary_id = key.summary_id;
  p_Var6 = (this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var7 = &(this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header;
  local_58._4_4_ = key.period_no;
  iVar1 = local_58._4_4_;
  p_Var4 = &p_Var7->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0;
      p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < local_58._4_4_]) {
    if (local_58._4_4_ <= (int)p_Var6[1]._M_color) {
      p_Var4 = p_Var6;
    }
  }
  p_Var6 = &p_Var7->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var7) &&
     (p_Var6 = p_Var4, local_58._4_4_ < (int)p_Var4[1]._M_color)) {
    p_Var6 = &p_Var7->_M_header;
  }
  uVar3 = key._0_8_;
  local_48.sidx = local_50;
  local_40.value = loss;
  if ((_Rb_tree_header *)p_Var6 != p_Var7) {
    local_40.period_weighting = (double)p_Var6[1]._M_parent;
    local_40.period_no = local_58._4_4_;
    local_58 = key._0_8_;
    pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](maxPeriodNo,(key_type *)&local_58);
    iVar2 = local_40.period_no;
    if (*pmVar5 < iVar1) {
      pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](maxPeriodNo,(key_type *)&local_58);
      *pmVar5 = iVar2;
    }
    this_00 = (vector<lossval,std::allocator<lossval>> *)
              std::
              map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
              ::operator[](items,&local_48);
    __position._M_current = *(lossval **)(this_00 + 8);
    if (__position._M_current == *(lossval **)(this_00 + 0x10)) {
      std::vector<lossval,std::allocator<lossval>>::_M_realloc_insert<lossval_const&>
                (this_00,__position,&local_40);
      uVar3 = local_58;
    }
    else {
      *(ulong *)&(__position._M_current)->value = CONCAT44(local_40._20_4_,local_40.value);
      *(ulong *)__position._M_current = CONCAT44(local_40._4_4_,local_40.period_no);
      (__position._M_current)->period_weighting = local_40.period_weighting;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x18;
      uVar3 = local_58;
    }
  }
  local_58 = uVar3;
  pVar8 = std::
          _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
          ::equal_range(&unusedperiodstoweighting->_M_t,(key_type *)((long)&local_58 + 4));
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::_M_erase_aux(&unusedperiodstoweighting->_M_t,(_Base_ptr)pVar8.first._M_node,
                 (_Base_ptr)pVar8.second._M_node);
  return;
}

Assistant:

inline void aggreports::FillWheatsheafItems(const outkey2 key,
	std::map<wheatkey, lossvec2> &items, const OASIS_FLOAT loss,
	std::map<int, int> &maxPeriodNo,
	std::map<int, double> &unusedperiodstoweighting) {

  wheatkey wk;
  wk.sidx = key.sidx;
  wk.summary_id = key.summary_id;
  lossval lv;
  lv.value = loss;
  auto iter = periodstoweighting_.find(key.period_no);
  if (iter != periodstoweighting_.end()) {
    lv.period_weighting = iter->second;
    lv.period_no = key.period_no;
    if (lv.period_no > maxPeriodNo[key.summary_id]) {
	maxPeriodNo[key.summary_id] = lv.period_no;
    }
    items[wk].push_back(lv);
  }
  unusedperiodstoweighting.erase(key.period_no);

}